

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O1

int Dau_DsdToGiaCompose_rec(Gia_Man_t *pGia,word Func,int *pFanins,int nVars)

{
  uint uVar1;
  uint nVars_00;
  int iVar2;
  int iData1;
  byte bVar3;
  ulong uVar4;
  
  uVar1 = nVars - 1;
  while( true ) {
    nVars_00 = uVar1;
    if (Func == 0) {
      return 0;
    }
    if (Func == 0xffffffffffffffff) {
      return 1;
    }
    if ((int)(nVars_00 + 1) < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                    ,0x3d,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
    }
    if (nVars_00 == 0) break;
    bVar3 = (byte)(1 << ((byte)nVars_00 & 0x1f));
    uVar1 = nVars_00 - 1;
    if ((s_Truths6Neg[nVars_00] & (Func >> (bVar3 & 0x3f) ^ Func)) != 0) {
      if (6 < (int)(nVars_00 + 1)) {
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x1bb,"word Abc_Tt6Cofactor0(word, int)");
      }
      uVar4 = s_Truths6Neg[nVars_00] & Func;
      iVar2 = Dau_DsdToGiaCompose_rec(pGia,uVar4 << (bVar3 & 0x3f) | uVar4,pFanins,nVars_00);
      iData1 = Dau_DsdToGiaCompose_rec
                         (pGia,(Func & s_Truths6[nVars_00]) >> (bVar3 & 0x3f) |
                               Func & s_Truths6[nVars_00],pFanins,nVars_00);
      if (pGia->pMuxes == (uint *)0x0) {
        iVar2 = Gia_ManHashMux(pGia,pFanins[nVars_00],iData1,iVar2);
        return iVar2;
      }
      iVar2 = Gia_ManHashMuxReal(pGia,pFanins[nVars_00],iData1,iVar2);
      return iVar2;
    }
  }
  if ((Func != 0xaaaaaaaaaaaaaaaa) && (Func != 0x5555555555555555)) {
    __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                  ,0x40,"int Dau_DsdToGiaCompose_rec(Gia_Man_t *, word, int *, int)");
  }
  if (-1 < *pFanins) {
    return *pFanins ^ (uint)(Func == 0x5555555555555555);
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10f,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Dau_DsdToGiaCompose_rec( Gia_Man_t * pGia, word Func, int * pFanins, int nVars )
{
    int t0, t1;
    if ( Func == 0 )
        return 0;
    if ( Func == ~(word)0 )
        return 1;
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        return Abc_LitNotCond( pFanins[0], (int)(Func == s_Truths6Neg[0]) );
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
        return Dau_DsdToGiaCompose_rec( pGia, Func, pFanins, nVars );
    t0 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor0(Func, nVars), pFanins, nVars );
    t1 = Dau_DsdToGiaCompose_rec( pGia, Abc_Tt6Cofactor1(Func, nVars), pFanins, nVars );
    if ( pGia->pMuxes )
        return Gia_ManHashMuxReal( pGia, pFanins[nVars], t1, t0 );
    else
        return Gia_ManHashMux( pGia, pFanins[nVars], t1, t0 );
}